

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<AV1Kmeans::AV1KmeansTest1_DISABLED_Speed_Test>::
CreateTest(ParameterizedTestFactory<AV1Kmeans::AV1KmeansTest1_DISABLED_Speed_Test> *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x4030);
  AV1Kmeans::AV1KmeansTest1_DISABLED_Speed_Test::AV1KmeansTest1_DISABLED_Speed_Test
            ((AV1KmeansTest1_DISABLED_Speed_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }